

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3ExprListToValues(Parse *pParse,int nElem,ExprList *pEList)

{
  Expr *pEVar1;
  Select *pSVar2;
  Select *pSVar3;
  char *pcVar4;
  uint local_44;
  int nExprElem;
  Expr *pExpr;
  Select *pSel;
  Select *pRet;
  int ii;
  ExprList *pEList_local;
  int nElem_local;
  Parse *pParse_local;
  
  pSel = (Select *)0x0;
  pRet._4_4_ = 0;
  do {
    if (pEList->nExpr <= pRet._4_4_) {
LAB_0021eb1e:
      if ((pSel != (Select *)0x0) && (pSel->pPrior != (Select *)0x0)) {
        pSel->selFlags = pSel->selFlags | 0x400;
      }
      sqlite3ExprListDelete(pParse->db,pEList);
      return pSel;
    }
    pEVar1 = pEList->a[pRet._4_4_].pExpr;
    if (pEVar1->op == 0xb1) {
      local_44 = ((pEVar1->x).pList)->nExpr;
    }
    else {
      local_44 = 1;
    }
    if (local_44 != nElem) {
      pcVar4 = "";
      if (1 < (int)local_44) {
        pcVar4 = "s";
      }
      sqlite3ErrorMsg(pParse,"IN(...) element has %d term%s - expected %d",(ulong)local_44,pcVar4,
                      (ulong)(uint)nElem);
      goto LAB_0021eb1e;
    }
    pSVar3 = sqlite3SelectNew(pParse,(pEVar1->x).pList,(SrcList *)0x0,(Expr *)0x0,(ExprList *)0x0,
                              (Expr *)0x0,(ExprList *)0x0,0x200,(Expr *)0x0);
    (pEVar1->x).pList = (ExprList *)0x0;
    pSVar2 = pSel;
    if ((pSVar3 != (Select *)0x0) && (pSVar2 = pSVar3, pSel != (Select *)0x0)) {
      pSVar3->op = 0x87;
      pSVar3->pPrior = pSel;
    }
    pSel = pSVar2;
    pRet._4_4_ = pRet._4_4_ + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE Select *sqlite3ExprListToValues(Parse *pParse, int nElem, ExprList *pEList){
  int ii;
  Select *pRet = 0;
  assert( nElem>1 );
  for(ii=0; ii<pEList->nExpr; ii++){
    Select *pSel;
    Expr *pExpr = pEList->a[ii].pExpr;
    int nExprElem;
    if( pExpr->op==TK_VECTOR ){
      assert( ExprUseXList(pExpr) );
      nExprElem = pExpr->x.pList->nExpr;
    }else{
      nExprElem = 1;
    }
    if( nExprElem!=nElem ){
      sqlite3ErrorMsg(pParse, "IN(...) element has %d term%s - expected %d",
          nExprElem, nExprElem>1?"s":"", nElem
      );
      break;
    }
    assert( ExprUseXList(pExpr) );
    pSel = sqlite3SelectNew(pParse, pExpr->x.pList, 0, 0, 0, 0, 0, SF_Values,0);
    pExpr->x.pList = 0;
    if( pSel ){
      if( pRet ){
        pSel->op = TK_ALL;
        pSel->pPrior = pRet;
      }
      pRet = pSel;
    }
  }

  if( pRet && pRet->pPrior ){
    pRet->selFlags |= SF_MultiValue;
  }
  sqlite3ExprListDelete(pParse->db, pEList);
  return pRet;
}